

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

int Fra_ClauCheckClause(Cla_Man_t *p,Vec_Int_t *vClause,Vec_Int_t *vCex)

{
  int *piVar1;
  lit *begin;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  int iVar5;
  
  iVar2 = p->nSatVarsTestCur;
  p->nSatVarsTestCur = iVar2 + 1;
  Vec_IntPush(vClause,iVar2 * 2);
  if (0 < vClause->nSize) {
    piVar1 = vClause->pArray;
    lVar4 = 0;
    do {
      *(byte *)(piVar1 + lVar4) = *(byte *)(piVar1 + lVar4) ^ 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vClause->nSize);
  }
  iVar2 = sat_solver_addclause(p->pSatTest,vClause->pArray,vClause->pArray + vClause->nSize);
  if (iVar2 == 1) {
    iVar2 = vClause->nSize;
    if (iVar2 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
    }
    piVar1 = vClause->pArray;
    vClause->nSize = iVar2 + -1;
    if (iVar2 != 1) {
      lVar4 = 0;
      do {
        *(byte *)(piVar1 + lVar4) = *(byte *)(piVar1 + lVar4) ^ 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 < vClause->nSize);
    }
    Fra_ClauRemapClause(p->pMapCsTestToNsTest,vClause,p->vCexAssm,0);
    iVar2 = p->nSatVarsTestBeg;
    if (iVar2 < p->nSatVarsTestCur + -1) {
      iVar5 = iVar2 * 2 + 1;
      do {
        Vec_IntPush(p->vCexAssm,iVar5);
        iVar2 = iVar2 + 1;
        iVar5 = iVar5 + 2;
      } while (iVar2 < p->nSatVarsTestCur + -1);
    }
    Vec_IntPush(p->vCexAssm,iVar2 * 2);
    begin = p->vCexAssm->pArray;
    iVar2 = sat_solver_solve(p->pSatTest,begin,begin + p->vCexAssm->nSize,0,0,0,0);
    if (vCex != (Vec_Int_t *)0x0) {
      vCex->nSize = 0;
    }
    iVar5 = 1;
    if (iVar2 != -1) {
      if (iVar2 != 1) {
        __assert_fail("RetValue == l_True",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                      ,0x1c3,"int Fra_ClauCheckClause(Cla_Man_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      iVar5 = 0;
      if ((vCex != (Vec_Int_t *)0x0) && (pVVar3 = p->vSatVarsTestCs, iVar5 = 0, 0 < pVVar3->nSize))
      {
        iVar5 = 0;
        lVar4 = 0;
        do {
          iVar2 = sat_solver_var_literal(p->pSatTest,pVVar3->pArray[lVar4]);
          Vec_IntPush(vCex,iVar2);
          lVar4 = lVar4 + 1;
          pVVar3 = p->vSatVarsTestCs;
        } while (lVar4 < pVVar3->nSize);
      }
    }
    return iVar5;
  }
  __assert_fail("RetValue == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                ,0x1b2,"int Fra_ClauCheckClause(Cla_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Fra_ClauCheckClause( Cla_Man_t * p, Vec_Int_t * vClause, Vec_Int_t * vCex )
{
    int nBTLimit = 0;
    int RetValue, iVar, i;
    // complement literals
    Vec_IntPush( vClause, toLit( p->nSatVarsTestCur++ ) ); // helper positive
    Vec_IntComplement( vClause ); // helper negative (the clause is C v h')
    // add the clause
    RetValue = sat_solver_addclause( p->pSatTest, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
    assert( RetValue == 1 );
    // complement all literals
    Vec_IntPop( vClause );  // helper removed
    Vec_IntComplement( vClause ); 
    // create the assumption in terms of NS variables
    Fra_ClauRemapClause( p->pMapCsTestToNsTest, vClause, p->vCexAssm, 0 );
    // add helper literals
    for ( i = p->nSatVarsTestBeg; i < p->nSatVarsTestCur - 1; i++ )
        Vec_IntPush( p->vCexAssm, toLitCond(i,1) ); // other helpers negative
    Vec_IntPush( p->vCexAssm, toLitCond(i,0) ); // positive helper
    // try to solve
    RetValue = sat_solver_solve( p->pSatTest, Vec_IntArray(p->vCexAssm), Vec_IntArray(p->vCexAssm) + Vec_IntSize(p->vCexAssm), 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( vCex )
        Vec_IntClear( vCex );
    if ( RetValue == l_False )
        return 1;
    assert( RetValue == l_True );
    if ( vCex )
    {
        Vec_IntForEachEntry( p->vSatVarsTestCs, iVar, i )
            Vec_IntPush( vCex, sat_solver_var_literal(p->pSatTest, iVar) );
    }
    return 0;
}